

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O3

u32 __thiscall
moira::Moira::readM<(moira::MemSpace)1,(moira::Size)4,96ul>(Moira *this,u32 addr,bool *error)

{
  u32 uVar1;
  u32 uVar2;
  uint uVar3;
  AEStackFrame frame;
  
  *error = SUB41(addr & 1,0);
  if ((addr & 1) == 0) {
    uVar1 = readM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,addr);
    uVar2 = readM<(moira::MemSpace)1,(moira::Size)2,96ul>(this,addr + 2);
    uVar3 = uVar2 | uVar1 << 0x10;
  }
  else {
    this->fcl = '\x01';
    frame = makeFrame<96ul>(this,addr);
    execAddressError(this,frame,2);
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

u32
Moira::readM(u32 addr, bool &error)
{
    // Check for address errors
    if ((error = misaligned<S>(addr))) {
        setFC(M == MEM_DATA ? FC_USER_DATA : FC_USER_PROG);
        execAddressError(makeFrame<F>(addr), 2);
        return 0;
    }
    
    return readM<M,S,F>(addr);
}